

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O0

void __thiscall
spvtools::opt::IRContext::AddCalls
          (IRContext *this,Function *func,
          queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *todo)

{
  UnderlyingIterator this_00;
  bool bVar1;
  Op OVar2;
  Instruction *pIVar3;
  uint32_t local_54;
  undefined1 local_50 [16];
  iterator ii;
  undefined1 local_30 [8];
  const_iterator bi;
  queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *todo_local;
  Function *func_local;
  IRContext *this_local;
  
  bi.iterator_._M_current =
       (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *)
       todo;
  _local_30 = Function::begin(func);
  while( true ) {
    _ii = Function::end(func);
    bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_true>::operator!=
                      ((UptrVectorIterator<spvtools::opt::BasicBlock,_true> *)local_30,
                       (UptrVectorIterator<spvtools::opt::BasicBlock,_true> *)&ii);
    if (!bVar1) break;
    UptrVectorIterator<spvtools::opt::BasicBlock,_true>::operator->
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_true> *)local_30);
    BasicBlock::begin((BasicBlock *)(local_50 + 8));
    while( true ) {
      UptrVectorIterator<spvtools::opt::BasicBlock,_true>::operator->
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_true> *)local_30);
      BasicBlock::end((BasicBlock *)local_50);
      bVar1 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)(local_50 + 8),
                                (iterator_template<spvtools::opt::Instruction> *)local_50);
      if (!bVar1) break;
      pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)(local_50 + 8));
      OVar2 = Instruction::opcode(pIVar3);
      this_00 = bi.iterator_;
      if (OVar2 == OpFunctionCall) {
        pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator->
                           ((iterator_template<spvtools::opt::Instruction> *)(local_50 + 8));
        local_54 = Instruction::GetSingleWordInOperand(pIVar3,0);
        std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
                  ((queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   this_00._M_current,&local_54);
      }
      InstructionList::iterator::operator++((iterator *)(local_50 + 8));
    }
    UptrVectorIterator<spvtools::opt::BasicBlock,_true>::operator++
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_true> *)local_30);
  }
  return;
}

Assistant:

void IRContext::AddCalls(const Function* func, std::queue<uint32_t>* todo) {
  for (auto bi = func->begin(); bi != func->end(); ++bi)
    for (auto ii = bi->begin(); ii != bi->end(); ++ii)
      if (ii->opcode() == spv::Op::OpFunctionCall)
        todo->push(ii->GetSingleWordInOperand(0));
}